

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

uint32_t inv_mix_column(uint32_t x)

{
  uint32_t x_00;
  uint32_t x_01;
  uint32_t uVar1;
  uint x_02;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t x13;
  uint32_t x11;
  uint32_t x9;
  uint32_t x4;
  uint32_t x2;
  uint32_t x_local;
  
  x_00 = gf_poly_mul2(x);
  x_01 = gf_poly_mul2(x_00);
  uVar1 = gf_poly_mul2(x_01);
  x_02 = x ^ uVar1;
  uVar1 = rotr32(x_00 ^ x_02,0x18);
  uVar2 = rotr32(x_01 ^ x_02,0x10);
  uVar3 = rotr32(x_02,8);
  return x ^ x_00 ^ x_01 ^ x_02 ^ uVar1 ^ uVar2 ^ uVar3;
}

Assistant:

static uint32_t inv_mix_column(uint32_t x)
{
  uint32_t x2 = gf_poly_mul2(x),
           x4 = gf_poly_mul2(x2),
           x9 = x ^ gf_poly_mul2(x4),
           x11 = x2 ^ x9,
           x13 = x4 ^ x9;

  return x ^ x2 ^ x13 ^ rotr32(x11, 24) ^ rotr32(x13, 16) ^ rotr32(x9, 8);
}